

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_fstore(jit_State *J)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  TRef TVar5;
  jit_State *pjVar6;
  long in_RDI;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef fref;
  IRIns *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  AliasRet in_stack_ffffffffffffffb4;
  jit_State *in_stack_ffffffffffffffb8;
  jit_State *in_stack_ffffffffffffffc0;
  uint local_34;
  uint16_t *local_30;
  
  uVar1 = *(ushort *)(in_RDI + 0xa0);
  sVar2 = *(short *)(in_RDI + 0xa2);
  lVar4 = *(long *)(in_RDI + 0x10);
  local_30 = (uint16_t *)(in_RDI + 0x218);
  uVar3 = *local_30;
  while (local_34 = (uint)uVar3, uVar1 < local_34) {
    in_stack_ffffffffffffffc0 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)local_34 * 8);
    in_stack_ffffffffffffffb4 =
         aa_fref(in_stack_ffffffffffffffb8,
                 (IRIns *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    if (in_stack_ffffffffffffffb4 != ALIAS_NO) {
      if (in_stack_ffffffffffffffb4 == ALIAS_MAY) {
        if (*(short *)((long)&(in_stack_ffffffffffffffc0->cur).nextgc.gcptr32 + 2) != sVar2) break;
      }
      else if (in_stack_ffffffffffffffb4 == ALIAS_MUST) {
        if (*(short *)((long)&(in_stack_ffffffffffffffc0->cur).nextgc.gcptr32 + 2) == sVar2) {
          return 4;
        }
        if (*(ushort *)(in_RDI + 0x1a4) < local_34) {
          pjVar6 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(*(int *)(in_RDI + 8) - 1) * 8);
          goto LAB_00168600;
        }
        break;
      }
    }
    local_30 = &(in_stack_ffffffffffffffc0->cur).nsnap;
    uVar3 = (in_stack_ffffffffffffffc0->cur).nsnap;
  }
LAB_001686bf:
  TVar5 = lj_ir_emit(in_stack_ffffffffffffffc0);
  return TVar5;
LAB_00168600:
  if (pjVar6 <= in_stack_ffffffffffffffc0) goto LAB_00168657;
  if ((((pjVar6->cur).marked & 0x80) != 0) ||
     (((pjVar6->cur).gct == 'D' &&
      (*(short *)((long)&(pjVar6->cur).nextgc.gcptr32 + 2) ==
       *(short *)(lVar4 + (ulong)(uint)uVar1 * 8 + 2))))) goto LAB_001686bf;
  pjVar6 = (jit_State *)&pjVar6[-1].prev_line;
  goto LAB_00168600;
LAB_00168657:
  *local_30 = (in_stack_ffffffffffffffc0->cur).nsnap;
  (in_stack_ffffffffffffffc0->cur).marked = '\0';
  (in_stack_ffffffffffffffc0->cur).gct = '\f';
  *(undefined2 *)((long)&(in_stack_ffffffffffffffc0->cur).nextgc.gcptr32 + 2) = 0;
  *(undefined2 *)&(in_stack_ffffffffffffffc0->cur).nextgc.gcptr32 = 0;
  (in_stack_ffffffffffffffc0->cur).nsnap = 0;
  goto LAB_001686bf;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}